

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

int __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
::ReadUInt(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
           *this,uint ub)

{
  int value;
  uint local_14;
  
  local_14 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
  if (ub <= local_14) {
    BinaryReaderBase::ReportError<int>
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x21c08e,(int *)&local_14);
  }
  return local_14;
}

Assistant:

int ReadUInt(unsigned ub) {
    int value = reader_.ReadUInt();
    unsigned unsigned_value = value;
    if (unsigned_value >= ub)
      reader_.ReportError("integer {} out of bounds", value);
    return value;
  }